

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtipccommon.cpp
# Opt level: O0

QNativeIpcKey * QtIpcCommon::platformSafeKey(QString *key,IpcType ipcType,Type type)

{
  QStringView s;
  bool bVar1;
  const_iterator pQVar2;
  short in_CX;
  IpcType in_EDX;
  undefined8 in_RSI;
  QChar c;
  QNativeIpcKey *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<char16_t,_const_QString_&> QVar3;
  QStringBuilder<QString_&,_char16_t> QVar4;
  const_iterator __end3;
  const_iterator __begin3;
  initializer_list<QStringView> *__range3;
  QNativeIpcKey *k;
  size_t RuntimeThreshold_1;
  size_t RuntimeThreshold;
  size_t i;
  size_t i_1;
  QString baseDir;
  QString result;
  QStringView mid;
  QStringView candidate;
  QStringView payload;
  QStringView prefix;
  undefined6 in_stack_fffffffffffffcf8;
  Type in_stack_fffffffffffffcfe;
  undefined4 in_stack_fffffffffffffd00;
  CaseSensitivity in_stack_fffffffffffffd04;
  undefined6 in_stack_fffffffffffffd08;
  undefined2 in_stack_fffffffffffffd0e;
  QStringView *in_stack_fffffffffffffd10;
  qsizetype in_stack_fffffffffffffd18;
  undefined6 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd26;
  undefined1 in_stack_fffffffffffffd27;
  storage_type_conflict *in_stack_fffffffffffffd28;
  const_iterator local_268;
  ulong local_1e8;
  undefined8 in_stack_fffffffffffffe20;
  StandardLocation type_00;
  ulong local_1d0;
  QChar local_162;
  QStringBuilder<QStringView_&,_QStringView_&> local_160;
  undefined1 *local_138;
  undefined1 *puStack_130;
  undefined1 *local_128;
  undefined1 *local_118;
  storage_type_conflict *local_110;
  undefined1 *local_108;
  storage_type_conflict *local_100;
  QStringView local_f8;
  QStringView local_e0;
  undefined1 *local_d0;
  storage_type_conflict *local_c8;
  undefined1 *local_c0;
  storage_type_conflict *local_b8;
  initializer_list<QStringView> local_b0;
  undefined1 *local_a0;
  storage_type_conflict *local_98;
  QStringView local_90;
  undefined2 local_7a;
  char16_t local_78;
  QString *local_70;
  QString *local_50;
  char16_t local_48;
  QStringView local_28;
  undefined8 local_18;
  char16_t *local_10;
  long local_8;
  
  type_00 = (StandardLocation)((ulong)in_stack_fffffffffffffe20 >> 0x20);
  c.ucs = (char16_t)((ulong)in_RSI >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(in_RDI,0xaa,0x28);
  QNativeIpcKey::QNativeIpcKey
            ((QNativeIpcKey *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
             in_stack_fffffffffffffcfe);
  bVar1 = QString::isEmpty((QString *)0x267d2a);
  if (bVar1) goto LAB_00268637;
  if (in_CX != 0x51) {
    if (in_CX == 0x100) {
      bVar1 = isIpcSupported(in_EDX,PosixRealtime);
      if (bVar1) {
        local_7a = 0x2f;
        QVar3 = ::operator+((char16_t *)
                            CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                            (QString *)CONCAT26(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8)
                           );
        local_70 = QVar3.b;
        local_78 = QVar3.a;
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<char16_t,_const_QString_&> *)
                   CONCAT26(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8));
        QNativeIpcKey::setNativeKey
                  ((QNativeIpcKey *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                   (QString *)CONCAT26(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8));
        QString::~QString((QString *)0x267e43);
      }
      goto LAB_00268637;
    }
    if (in_CX == 0x101) {
      bVar1 = isIpcSupported(in_EDX,Windows);
      if (bVar1) {
        local_90.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_90.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        QStringView::QStringView(&local_90);
        local_a0 = &DAT_aaaaaaaaaaaaaaaa;
        local_98 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        QStringView::QStringView<QString,_true>
                  (in_stack_fffffffffffffd10,
                   (QString *)CONCAT26(in_stack_fffffffffffffd0e,in_stack_fffffffffffffd08));
        local_28.m_size = 6;
        local_28.m_data = L"Local\\";
        local_18 = 7;
        local_10 = L"Global\\";
        local_b0._M_array = &local_28;
        local_b0._M_len = 2;
        local_268 = std::initializer_list<QStringView>::begin(&local_b0);
        pQVar2 = std::initializer_list<QStringView>::end
                           ((initializer_list<QStringView> *)
                            CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
        for (; local_268 != pQVar2; local_268 = local_268 + 1) {
          local_d0 = (undefined1 *)local_268->m_size;
          local_c8 = local_268->m_data;
          s.m_size._6_1_ = in_stack_fffffffffffffd26;
          s.m_size._0_6_ = in_stack_fffffffffffffd20;
          s.m_size._7_1_ = in_stack_fffffffffffffd27;
          s.m_data = in_stack_fffffffffffffd28;
          local_c0 = local_d0;
          local_b8 = local_c8;
          bVar1 = QString::startsWith((QString *)
                                      CONCAT26(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8),
                                      s,CaseInsensitive);
          if (bVar1) {
            local_90.m_size = (qsizetype)local_c0;
            local_90.m_data = local_b8;
            QStringView::size(&local_90);
            local_e0 = QStringView::sliced((QStringView *)
                                           CONCAT17(in_stack_fffffffffffffd27,
                                                    CONCAT16(in_stack_fffffffffffffd26,
                                                             in_stack_fffffffffffffd20)),
                                           in_stack_fffffffffffffd18);
            local_a0 = (undefined1 *)local_e0.m_size;
            local_98 = local_e0.m_data;
            break;
          }
        }
        local_f8.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_f8.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        QStringView::QStringView(&local_f8);
        if (in_EDX == SharedMemory) {
          std::data<char16_t_const,5ul>((char16_t (*) [5])L"shm_");
          for (local_1e8 = 0; (local_1e8 < 5 && (L"shm_"[local_1e8] != L'\0'));
              local_1e8 = local_1e8 + 1) {
          }
          QStringView::QStringView<char16_t,_true>
                    (in_stack_fffffffffffffd10,
                     (char16_t *)CONCAT26(in_stack_fffffffffffffd0e,in_stack_fffffffffffffd08),
                     CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
          local_f8.m_size = (qsizetype)local_108;
          local_f8.m_data = local_100;
        }
        else if (in_EDX == SystemSemaphore) {
          std::data<char16_t_const,5ul>((char16_t (*) [5])L"sem_");
          for (local_1d0 = 0; (local_1d0 < 5 && (L"sem_"[local_1d0] != L'\0'));
              local_1d0 = local_1d0 + 1) {
          }
          QStringView::QStringView<char16_t,_true>
                    (in_stack_fffffffffffffd10,
                     (char16_t *)CONCAT26(in_stack_fffffffffffffd0e,in_stack_fffffffffffffd08),
                     CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
          local_f8.m_size = (qsizetype)local_118;
          local_f8.m_data = local_110;
        }
        local_138 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_130 = &DAT_aaaaaaaaaaaaaaaa;
        local_128 = &DAT_aaaaaaaaaaaaaaaa;
        local_160 = ::operator+((QStringView *)
                                CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                                (QStringView *)
                                CONCAT26(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8));
        ::operator+((QStringBuilder<QStringView_&,_QStringView_&> *)
                    CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                    (QStringView *)CONCAT26(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8));
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QStringBuilder<QStringView_&,_QStringView_&>,_QStringView_&> *)
                   CONCAT26(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8));
        QNativeIpcKey::setNativeKey
                  ((QNativeIpcKey *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                   (QString *)CONCAT26(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8));
        QString::~QString((QString *)0x268405);
      }
      goto LAB_00268637;
    }
  }
  bVar1 = isIpcSupported(in_EDX,SystemV);
  if (bVar1) {
    QChar::QChar<char16_t,_true>(&local_162,L'/');
    bVar1 = QString::startsWith((QString *)
                                CONCAT26(in_stack_fffffffffffffd0e,in_stack_fffffffffffffd08),c,
                                in_stack_fffffffffffffd04);
    if (bVar1) {
      QNativeIpcKey::setNativeKey
                ((QNativeIpcKey *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                 (QString *)CONCAT26(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8));
    }
    else {
      QStandardPaths::writableLocation(type_00);
      QVar4 = ::operator+((QString *)CONCAT26(in_stack_fffffffffffffd0e,in_stack_fffffffffffffd08),
                          (char16_t *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00))
      ;
      local_50 = QVar4.a;
      local_48 = QVar4.b;
      ::operator+((QStringBuilder<QString_&,_char16_t> *)
                  CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                  (QString *)CONCAT26(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8));
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QStringBuilder<QString_&,_char16_t>,_const_QString_&> *)
                 CONCAT26(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8));
      QNativeIpcKey::setNativeKey
                ((QNativeIpcKey *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                 (QString *)CONCAT26(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8));
      QString::~QString((QString *)0x2685c5);
      QString::~QString((QString *)0x2685d2);
    }
  }
LAB_00268637:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QNativeIpcKey QtIpcCommon::platformSafeKey(const QString &key, QtIpcCommon::IpcType ipcType,
                                           QNativeIpcKey::Type type)
{
    QNativeIpcKey k(type);
    if (key.isEmpty())
        return k;

    switch (type) {
    case QNativeIpcKey::Type::PosixRealtime:
        if (isIpcSupported(ipcType, QNativeIpcKey::Type::PosixRealtime)) {
#ifdef SHM_NAME_MAX
            // The shared memory name limit on Apple platforms is very low (30
            // characters), so we have to cut it down to avoid ENAMETOOLONG. We
            // hope that there won't be too many collisions...
            k.setNativeKey(u'/' + QStringView(key).left(SHM_NAME_MAX - 1));
#else
            k.setNativeKey(u'/' + key);
#endif
        }
        return k;

    case QNativeIpcKey::Type::Windows:
        if (isIpcSupported(ipcType, QNativeIpcKey::Type::Windows)) {
            QStringView prefix;
            QStringView payload = key;
            // see https://learn.microsoft.com/en-us/windows/win32/termserv/kernel-object-namespaces
            for (QStringView candidate : { u"Local\\"_sv, u"Global\\"_sv }) {
                if (!key.startsWith(candidate))
                    continue;
                prefix = candidate;
                payload = payload.sliced(prefix.size());
                break;
            }

            QStringView mid;
            switch (ipcType) {
            case IpcType::SharedMemory:     mid = u"shm_"; break;
            case IpcType::SystemSemaphore:  mid = u"sem_"; break;
            }

            QString result = prefix + mid + payload;
#ifdef Q_OS_WINDOWS
            result.truncate(MAX_PATH);
#endif
            k.setNativeKey(result);
        }
        return k;

    case QNativeIpcKey::Type::SystemV:
        break;
    }

    // System V
    if (isIpcSupported(ipcType, QNativeIpcKey::Type::SystemV)) {
        if (key.startsWith(u'/')) {
            k.setNativeKey(key);
        } else {
            QString baseDir = QStandardPaths::writableLocation(QStandardPaths::RuntimeLocation);
            k.setNativeKey(baseDir + u'/' + key);
        }
    }
    return k;
}